

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlXPathCompExprPtr xmlXPathTryStreamCompile(xmlXPathContextPtr ctxt,xmlChar *str)

{
  undefined8 *puVar1;
  long lVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlChar **namespaces;
  ulong uVar5;
  xmlPatternPtr comp;
  xmlXPathCompExprPtr pxVar6;
  ulong uVar7;
  char *extra;
  xmlDictPtr dict;
  
  pxVar4 = xmlStrchr(str,'[');
  if (pxVar4 != (xmlChar *)0x0) {
    return (xmlXPathCompExprPtr)0x0;
  }
  pxVar4 = xmlStrchr(str,'(');
  if (pxVar4 != (xmlChar *)0x0) {
    return (xmlXPathCompExprPtr)0x0;
  }
  pxVar4 = xmlStrchr(str,'@');
  if (pxVar4 != (xmlChar *)0x0) {
    return (xmlXPathCompExprPtr)0x0;
  }
  pxVar4 = xmlStrchr(str,':');
  if (pxVar4 == (xmlChar *)0x0) {
    if (ctxt != (xmlXPathContextPtr)0x0) {
      iVar3 = ctxt->nsNr;
      goto LAB_001d3be7;
    }
    namespaces = (xmlChar **)0x0;
    dict = (xmlDictPtr)0x0;
  }
  else {
    if (ctxt == (xmlXPathContextPtr)0x0) {
      return (xmlXPathCompExprPtr)0x0;
    }
    iVar3 = ctxt->nsNr;
    if (iVar3 == 0) {
      return (xmlXPathCompExprPtr)0x0;
    }
    if (pxVar4[1] == ':') {
      return (xmlXPathCompExprPtr)0x0;
    }
LAB_001d3be7:
    dict = ctxt->dict;
    if (iVar3 < 1) {
      namespaces = (xmlChar **)0x0;
    }
    else {
      namespaces = (xmlChar **)(*xmlMalloc)((ulong)(iVar3 * 2 + 2) << 3);
      if (namespaces == (xmlChar **)0x0) {
        extra = "allocating namespaces array\n";
        goto LAB_001d3cd8;
      }
      uVar5 = 0;
      uVar7 = (ulong)(uint)ctxt->nsNr;
      if (ctxt->nsNr < 1) {
        uVar7 = uVar5;
      }
      for (; uVar7 * 8 != uVar5; uVar5 = uVar5 + 8) {
        lVar2 = *(long *)((long)ctxt->namespaces + uVar5);
        *(undefined8 *)((long)namespaces + uVar5 * 2) = *(undefined8 *)(lVar2 + 0x10);
        *(undefined8 *)((long)namespaces + uVar5 * 2 + 8) = *(undefined8 *)(lVar2 + 0x18);
      }
      puVar1 = (undefined8 *)((long)namespaces + uVar5 * 2);
      *puVar1 = 0;
      puVar1[1] = 0;
    }
  }
  comp = xmlPatterncompile(str,dict,1,namespaces);
  if (namespaces != (xmlChar **)0x0) {
    (*xmlFree)(namespaces);
  }
  if ((comp == (xmlPatternPtr)0x0) || (iVar3 = xmlPatternStreamable(comp), iVar3 != 1)) {
    xmlFreePattern(comp);
    return (xmlXPathCompExprPtr)0x0;
  }
  pxVar6 = xmlXPathNewCompExpr();
  if (pxVar6 != (xmlXPathCompExprPtr)0x0) {
    pxVar6->stream = comp;
    pxVar6->dict = dict;
    if (dict != (xmlDictPtr)0x0) {
      xmlDictReference(dict);
      return pxVar6;
    }
    return pxVar6;
  }
  extra = "allocating streamable expression\n";
LAB_001d3cd8:
  xmlXPathErrMemory(ctxt,extra);
  return (xmlXPathCompExprPtr)0x0;
}

Assistant:

static xmlXPathCompExprPtr
xmlXPathTryStreamCompile(xmlXPathContextPtr ctxt, const xmlChar *str) {
    /*
     * Optimization: use streaming patterns when the XPath expression can
     * be compiled to a stream lookup
     */
    xmlPatternPtr stream;
    xmlXPathCompExprPtr comp;
    xmlDictPtr dict = NULL;
    const xmlChar **namespaces = NULL;
    xmlNsPtr ns;
    int i, j;

    if ((!xmlStrchr(str, '[')) && (!xmlStrchr(str, '(')) &&
        (!xmlStrchr(str, '@'))) {
	const xmlChar *tmp;

	/*
	 * We don't try to handle expressions using the verbose axis
	 * specifiers ("::"), just the simplified form at this point.
	 * Additionally, if there is no list of namespaces available and
	 *  there's a ":" in the expression, indicating a prefixed QName,
	 *  then we won't try to compile either. xmlPatterncompile() needs
	 *  to have a list of namespaces at compilation time in order to
	 *  compile prefixed name tests.
	 */
	tmp = xmlStrchr(str, ':');
	if ((tmp != NULL) &&
	    ((ctxt == NULL) || (ctxt->nsNr == 0) || (tmp[1] == ':')))
	    return(NULL);

	if (ctxt != NULL) {
	    dict = ctxt->dict;
	    if (ctxt->nsNr > 0) {
		namespaces = xmlMalloc(2 * (ctxt->nsNr + 1) * sizeof(xmlChar*));
		if (namespaces == NULL) {
		    xmlXPathErrMemory(ctxt, "allocating namespaces array\n");
		    return(NULL);
		}
		for (i = 0, j = 0; (j < ctxt->nsNr); j++) {
		    ns = ctxt->namespaces[j];
		    namespaces[i++] = ns->href;
		    namespaces[i++] = ns->prefix;
		}
		namespaces[i++] = NULL;
		namespaces[i] = NULL;
	    }
	}

	stream = xmlPatterncompile(str, dict, XML_PATTERN_XPATH, namespaces);
	if (namespaces != NULL) {
	    xmlFree((xmlChar **)namespaces);
	}
	if ((stream != NULL) && (xmlPatternStreamable(stream) == 1)) {
	    comp = xmlXPathNewCompExpr();
	    if (comp == NULL) {
		xmlXPathErrMemory(ctxt, "allocating streamable expression\n");
		return(NULL);
	    }
	    comp->stream = stream;
	    comp->dict = dict;
	    if (comp->dict)
		xmlDictReference(comp->dict);
	    return(comp);
	}
	xmlFreePattern(stream);
    }
    return(NULL);
}